

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureTransform.cpp
# Opt level: O3

void __thiscall Assimp::TextureTransformStep::Execute(TextureTransformStep *this,aiScene *pScene)

{
  _List_node_base **pp_Var1;
  aiVector3D **ppaVar2;
  aiVector3D **ppaVar3;
  float *pfVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uint uVar7;
  aiMaterial *paVar8;
  aiVector2D *paVar9;
  aiMesh *paVar10;
  aiVector3D *__src;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  bool bVar13;
  uint n;
  int iVar14;
  uint uVar15;
  int iVar16;
  Logger *pLVar17;
  _List_node_base *p_Var18;
  _List_node_base *p_Var19;
  long lVar20;
  _List_node_base *p_Var21;
  _List_node_base *p_Var22;
  aiVector3D *__s;
  void *pvVar23;
  _Node *p_Var24;
  uint uVar25;
  char *pcVar26;
  _List_node_base *p_Var27;
  int iVar28;
  bool bVar29;
  uint uVar30;
  bool bVar31;
  ulong uVar32;
  TextureTransformStep *this_00;
  TextureTransformStep *__s1;
  TextureTransformStep *pTVar33;
  char *pcVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  iterator __position;
  list<Assimp::STransformVecInfo,std::allocator<Assimp::STransformVecInfo>> *plVar38;
  list<Assimp::STransformVecInfo,std::allocator<Assimp::STransformVecInfo>> *plVar39;
  long lVar40;
  float fVar41;
  float fVar42;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  bool ref [8];
  vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
  meshLists;
  aiVector3D *old [8];
  char buffer [1024];
  uint local_664;
  _List_node_base *local_650;
  uint local_624;
  aiScene *local_620;
  ushort auStack_618 [4];
  char *local_610;
  char local_600 [16];
  vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
  local_5f0;
  float local_5d8;
  undefined4 uStack_5d4;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  _List_node_base local_5b8;
  ai_real local_5a8;
  undefined8 uStack_5a4;
  aiTextureMapMode aStack_59c;
  uint uStack_598;
  undefined4 uStack_594;
  _List_node_base *p_Stack_590;
  undefined1 local_588 [64];
  ios_base local_548 [272];
  STransformVecInfo local_438 [16];
  
  pLVar17 = DefaultLogger::get();
  Logger::debug(pLVar17,"TransformUVCoordsProcess begin");
  std::
  vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
  ::vector(&local_5f0,(ulong)pScene->mNumMeshes,(allocator_type *)local_438);
  uVar30 = pScene->mNumMaterials;
  local_620 = pScene;
  if (uVar30 != 0) {
    uVar36 = 0;
    do {
      paVar8 = pScene->mMaterials[uVar36];
      if (paVar8->mNumProperties != 0) {
        uVar37 = 0;
        do {
          p_Var19 = (&((_List_node_base *)paVar8->mProperties)->_M_next)[uVar37];
          this_00 = (TextureTransformStep *)((long)&p_Var19->_M_next + 4);
          iVar14 = strcmp((char *)this_00,"$tex.file");
          if (iVar14 == 0) {
            local_438[0].super_aiUVTransform.mTranslation.x = 0.0;
            local_438[0].super_aiUVTransform.mTranslation.y = 0.0;
            local_438[0].super_aiUVTransform.mScaling.x = 1.0;
            local_438[0].super_aiUVTransform.mScaling.y = 1.0;
            local_438[0].super_aiUVTransform.mRotation = 0.0;
            local_438[0].uvIndex = 0;
            local_438[0].mapU = aiTextureMapMode_Wrap;
            local_438[0].mapV = aiTextureMapMode_Wrap;
            local_438[0].lockedPos = 0xeeeeeeee;
            local_438[0].updateList.
            super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>._M_impl.
            _M_node.super__List_node_base._M_next = (_List_node_base *)&local_438[0].updateList;
            local_438[0].updateList.
            super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>._M_impl.
            _M_node._M_size = 0;
            uVar5 = *(undefined4 *)((long)&p_Var19[0x40]._M_next + 4);
            uVar6 = *(undefined4 *)&p_Var19[0x40]._M_prev;
            local_438[0].updateList.
            super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>._M_impl.
            _M_node.super__List_node_base._M_prev =
                 local_438[0].updateList.
                 super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>.
                 _M_impl._M_node.super__List_node_base._M_next;
            if (paVar8->mNumProperties == 0) {
              local_650 = (_List_node_base *)0x0;
            }
            else {
              uVar30 = 0;
              local_650 = (_List_node_base *)0x0;
              do {
                uVar35 = (ulong)uVar30;
                pTVar33 = (TextureTransformStep *)
                          (&((_List_node_base *)paVar8->mProperties)->_M_next)[uVar35];
                if ((*(int *)((long)&pTVar33[0x20].super_BaseProcess._vptr_BaseProcess + 4) ==
                     *(int *)((long)&p_Var19[0x40]._M_next + 4)) &&
                   (*(int *)&pTVar33[0x20].super_BaseProcess.shared ==
                    *(int *)&p_Var19[0x40]._M_prev)) {
                  __s1 = (TextureTransformStep *)
                         ((long)&(pTVar33->super_BaseProcess)._vptr_BaseProcess + 4);
                  this_00 = __s1;
                  iVar14 = strcmp((char *)__s1,"$tex.uvwsrc");
                  if (iVar14 == 0) {
                    local_650 = *(_List_node_base **)&pTVar33[0x20].configFlags;
                    local_438[0].uvIndex = *(undefined4 *)&local_650->_M_next;
                  }
                  else {
                    this_00 = __s1;
                    iVar14 = strcmp((char *)__s1,"$tex.mapmodeu");
                    if (iVar14 == 0) {
                      local_438[0].mapU = **(aiTextureMapMode **)&pTVar33[0x20].configFlags;
                    }
                    else {
                      this_00 = __s1;
                      iVar14 = strcmp((char *)__s1,"$tex.mapmodev");
                      if (iVar14 == 0) {
                        local_438[0].mapV = **(aiTextureMapMode **)&pTVar33[0x20].configFlags;
                      }
                      else {
                        iVar14 = strcmp((char *)__s1,"$tex.uvtrafo");
                        this_00 = __s1;
                        if (iVar14 == 0) {
                          if (*(uint *)((long)&pTVar33[0x20].super_BaseProcess.shared + 4) < 0x14) {
                            __assert_fail("prop2->mDataLength >= 20",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/TextureTransform.cpp"
                                          ,0x10f,
                                          "virtual void Assimp::TextureTransformStep::Execute(aiScene *)"
                                         );
                          }
                          paVar9 = *(aiVector2D **)&pTVar33[0x20].configFlags;
                          local_438[0].super_aiUVTransform.mRotation = paVar9[2].x;
                          local_438[0].super_aiUVTransform.mTranslation = *paVar9;
                          local_438[0].super_aiUVTransform.mScaling = paVar9[1];
                          uVar15 = paVar8->mNumProperties - 1;
                          paVar8->mNumProperties = uVar15;
                          if (uVar30 < uVar15) {
                            do {
                              (&((_List_node_base *)paVar8->mProperties)->_M_next)[uVar35] =
                                   (&((_List_node_base *)paVar8->mProperties)->_M_prev)[uVar35];
                              uVar35 = uVar35 + 1;
                            } while (uVar35 < paVar8->mNumProperties);
                            if (pTVar33 != (TextureTransformStep *)0x0) goto LAB_0015e648;
                          }
                          else {
LAB_0015e648:
                            if (*(void **)&pTVar33[0x20].configFlags != (void *)0x0) {
                              operator_delete__(*(void **)&pTVar33[0x20].configFlags);
                            }
                            *(undefined8 *)&pTVar33[0x20].configFlags = 0;
                          }
                          operator_delete(pTVar33);
                          uVar30 = uVar30 - 1;
                          this_00 = pTVar33;
                        }
                      }
                    }
                  }
                }
                uVar30 = uVar30 + 1;
              } while (uVar30 < paVar8->mNumProperties);
            }
            pScene = local_620;
            uVar30 = this->configFlags;
            if ((uVar30 & 2) == 0) {
              local_438[0]._16_8_ = local_438[0]._16_8_ & 0xffffffff00000000;
            }
            if ((uVar30 & 1) == 0) {
              local_438[0].super_aiUVTransform.mScaling.x = 1.0;
              local_438[0].super_aiUVTransform.mScaling.y = 1.0;
            }
            if ((uVar30 & 4) == 0) {
              local_438[0].super_aiUVTransform.mTranslation.x = 0.0;
              local_438[0].super_aiUVTransform.mTranslation.y = 0.0;
            }
            PreProcessUVTransform(this_00,local_438);
            uVar30 = local_438[0].uvIndex;
            if (6 < local_438[0].uvIndex) {
              uVar30 = 7;
            }
            local_438[0].uvIndex = uVar30;
            uVar35 = (ulong)pScene->mNumMeshes;
            if (uVar35 != 0) {
              uVar32 = 0;
              iVar14 = 0;
              do {
                iVar14 = iVar14 + (uint)(uVar36 == pScene->mMeshes[uVar32]->mMaterialIndex);
                uVar32 = uVar32 + 1;
              } while (uVar35 != uVar32);
              if (iVar14 != 0) {
                if (iVar14 != 1) {
                  local_438[0].lockedPos = 0xffffffff;
                }
                if (uVar35 != 0) {
                  uVar35 = 0;
                  do {
                    paVar10 = pScene->mMeshes[uVar35];
                    if ((uVar36 == paVar10->mMaterialIndex) &&
                       (paVar10->mTextureCoords[0] != (aiVector3D *)0x0)) {
                      uVar30 = local_438[0].uvIndex;
                      if (paVar10->mTextureCoords[local_438[0].uvIndex] == (aiVector3D *)0x0) {
                        uVar30 = 0;
                      }
                      if (paVar10->mNumUVComponents[local_438[0].uvIndex] < 3) {
                        plVar39 = (list<Assimp::STransformVecInfo,std::allocator<Assimp::STransformVecInfo>>
                                   *)(local_5f0.
                                      super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar35);
                        plVar38 = *(list<Assimp::STransformVecInfo,std::allocator<Assimp::STransformVecInfo>>
                                    **)plVar39;
                        if (plVar38 != plVar39) {
                          do {
                            if (((((ABS(*(float *)(plVar38 + 0x10) -
                                        local_438[0].super_aiUVTransform.mTranslation.x) <= 0.05) &&
                                  (ABS(*(float *)(plVar38 + 0x14) -
                                       local_438[0].super_aiUVTransform.mTranslation.y) <= 0.05)) &&
                                 (ABS(*(float *)(plVar38 + 0x18) -
                                      local_438[0].super_aiUVTransform.mScaling.x) <= 0.05)) &&
                                ((ABS(*(float *)(plVar38 + 0x1c) -
                                      local_438[0].super_aiUVTransform.mScaling.y) <= 0.05 &&
                                 (ABS(*(float *)(plVar38 + 0x20) -
                                      local_438[0].super_aiUVTransform.mRotation) <= 0.05)))) &&
                               (*(uint *)(plVar38 + 0x24) == uVar30)) {
                              p_Var19 = (_List_node_base *)operator_new(0x28);
                              p_Var19[1]._M_next = local_650;
                              p_Var19[1]._M_prev = (_List_node_base *)paVar8;
                              *(undefined4 *)&p_Var19[2]._M_next = uVar5;
                              *(undefined4 *)((long)&p_Var19[2]._M_next + 4) = uVar6;
                              std::__detail::_List_node_base::_M_hook(p_Var19);
                              *(long *)(plVar38 + 0x48) = *(long *)(plVar38 + 0x48) + 1;
                              plVar39 = plVar38;
                              break;
                            }
                            plVar38 = *(list<Assimp::STransformVecInfo,std::allocator<Assimp::STransformVecInfo>>
                                        **)plVar38;
                          } while (plVar38 != plVar39);
                        }
                        plVar38 = (list<Assimp::STransformVecInfo,std::allocator<Assimp::STransformVecInfo>>
                                   *)(local_5f0.
                                      super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar35);
                        if (plVar39 == plVar38) {
                          p_Var24 = std::__cxx11::
                                    list<Assimp::STransformVecInfo,std::allocator<Assimp::STransformVecInfo>>
                                    ::_M_create_node<Assimp::STransformVecInfo_const&>
                                              (plVar38,local_438);
                          std::__detail::_List_node_base::_M_hook(&p_Var24->super__List_node_base);
                          *(long *)(plVar38 + 0x10) = *(long *)(plVar38 + 0x10) + 1;
                          *(uint *)((long)&local_5f0.
                                           super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar35].
                                           super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
                                           ._M_impl._M_node.super__List_node_base._M_prev[2]._M_next
                                   + 4) = uVar30;
                          p_Var19 = local_5f0.
                                    super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar35].
                                    super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
                                    ._M_impl._M_node.super__List_node_base._M_prev;
                          p_Var18 = (_List_node_base *)operator_new(0x28);
                          p_Var18[1]._M_next = local_650;
                          p_Var18[1]._M_prev = (_List_node_base *)paVar8;
                          *(undefined4 *)&p_Var18[2]._M_next = uVar5;
                          *(undefined4 *)((long)&p_Var18[2]._M_next + 4) = uVar6;
                          std::__detail::_List_node_base::_M_hook(p_Var18);
                          pp_Var1 = &p_Var19[4]._M_prev;
                          *pp_Var1 = (_List_node_base *)((long)&(*pp_Var1)->_M_next + 1);
                        }
                      }
                      else {
                        pLVar17 = DefaultLogger::get();
                        Logger::warn(pLVar17,
                                     "UV transformations on 3D mapping channels are not supported");
                      }
                    }
                    uVar35 = uVar35 + 1;
                  } while (uVar35 < pScene->mNumMeshes);
                }
                p_Var19 = local_438[0].updateList.
                          super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>
                          ._M_impl._M_node.super__List_node_base._M_next;
                while (p_Var19 != (_List_node_base *)&local_438[0].updateList) {
                  p_Var18 = (((_List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>
                               *)&p_Var19->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
                  operator_delete(p_Var19);
                  p_Var19 = p_Var18;
                }
                goto LAB_0015e9dc;
              }
            }
            p_Var19 = local_438[0].updateList.
                      super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>.
                      _M_impl._M_node.super__List_node_base._M_next;
            while (p_Var19 != (_List_node_base *)&local_438[0].updateList) {
              p_Var18 = p_Var19->_M_next;
              operator_delete(p_Var19);
              p_Var19 = p_Var18;
            }
          }
LAB_0015e9dc:
          uVar37 = uVar37 + 1;
        } while (uVar37 < paVar8->mNumProperties);
        uVar30 = pScene->mNumMaterials;
      }
      uVar36 = uVar36 + 1;
    } while (uVar36 < uVar30);
  }
  if (pScene->mNumMeshes == 0) {
    iVar14 = 0;
LAB_0015f474:
    bVar13 = DefaultLogger::isNullLogger();
    if (!bVar13) {
      if (iVar14 == 0) {
        pLVar17 = DefaultLogger::get();
        Logger::debug(pLVar17,"TransformUVCoordsProcess finished");
      }
      else {
        pLVar17 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[31]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_5b8,(char (*) [31])"TransformUVCoordsProcess end: ");
        std::ostream::_M_insert<unsigned_long>((ulong)&local_5b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_5b8," output channels (in: ",0x16);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_5b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,", modified: ",0xc)
        ;
        std::ostream::_M_insert<unsigned_long>((ulong)&local_5b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,")",1);
        std::__cxx11::stringbuf::str();
        Logger::info(pLVar17,local_610);
        if (local_610 != local_600) {
          operator_delete(local_610);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_5b8);
        std::ios_base::~ios_base(local_548);
      }
    }
    std::
    vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
    ::~vector(&local_5f0);
    return;
  }
  uVar36 = 0;
  p_Var19 = (_List_node_base *)0x0;
  iVar14 = 0;
LAB_0015ea1f:
  iVar28 = (int)p_Var19;
  paVar10 = pScene->mMeshes[uVar36];
  p_Var18 = (_List_node_base *)
            (local_5f0.
             super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar36);
  ppaVar2 = paVar10->mTextureCoords;
  lVar40 = 0;
  do {
    if (ppaVar2[lVar40] == (aiVector3D *)0x0) goto LAB_0015ea54;
    lVar40 = lVar40 + 1;
  } while (lVar40 != 8);
  lVar40 = 8;
LAB_0015ea54:
  if (((*ppaVar2 != (aiVector3D *)0x0) &&
      (__position._M_node = p_Var18->_M_next, __position._M_node != p_Var18)) &&
     ((p_Var18[1]._M_next != (_List_node_base *)0x1 ||
      ((auVar49._4_4_ = -(uint)(*(float *)((long)&__position._M_node[1]._M_next + 4) != 0.0),
       auVar49._0_4_ = -(uint)(*(float *)&__position._M_node[1]._M_next != 0.0),
       auVar49._8_4_ = -(uint)(*(float *)&__position._M_node[1]._M_prev != 1.0),
       auVar49._12_4_ = -(uint)(*(float *)((long)&__position._M_node[1]._M_prev + 4) != 1.0),
       iVar16 = movmskps((int)pScene->mMeshes,auVar49), iVar16 != 0 ||
       (0.008726646 < *(float *)&__position._M_node[2]._M_next ||
        *(float *)&__position._M_node[2]._M_next == 0.008726646)))))) {
    bVar13 = false;
    iVar16 = 0;
    bVar29 = false;
    do {
      auVar43._4_4_ = -(uint)(*(float *)((long)&__position._M_node[1]._M_next + 4) != 0.0);
      auVar43._0_4_ = -(uint)(*(float *)&__position._M_node[1]._M_next != 0.0);
      auVar43._8_4_ = -(uint)(*(float *)&__position._M_node[1]._M_prev != 1.0);
      auVar43._12_4_ = -(uint)(*(float *)((long)&__position._M_node[1]._M_prev + 4) != 1.0);
      uVar30 = movmskps((int)p_Var19,auVar43);
      p_Var19 = (_List_node_base *)(ulong)uVar30;
      bVar31 = true;
      if (uVar30 == 0) {
        bVar31 = (bool)((0.008726646 < *(float *)&__position._M_node[2]._M_next ||
                        *(float *)&__position._M_node[2]._M_next == 0.008726646) | bVar29);
      }
      if (*(int *)&__position._M_node[3]._M_next == -1) {
        *(int *)&__position._M_node[3]._M_next = iVar16;
        bVar13 = true;
      }
      else {
        bVar29 = !bVar13;
        bVar13 = true;
        if (((bVar29) && (bVar13 = false, (char)uVar30 == '\0')) &&
           (p_Var21 = p_Var18->_M_next, p_Var19 = p_Var18, __position._M_node != p_Var21)) {
          if (*(float *)&__position._M_node[2]._M_next <= 0.008726646 &&
              *(float *)&__position._M_node[2]._M_next != 0.008726646) {
            goto LAB_0015f405;
          }
          bVar13 = false;
        }
      }
      __position._M_node = (__position._M_node)->_M_next;
      iVar16 = iVar16 + 1;
      bVar29 = bVar31;
    } while (__position._M_node != p_Var18);
    goto LAB_0015eb47;
  }
  lVar20 = 0;
  do {
    if (ppaVar2[lVar20] == (aiVector3D *)0x0) break;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 8);
  goto LAB_0015f3ec;
  while( true ) {
    p_Var21 = p_Var21->_M_next;
    iVar16 = 0;
    if (p_Var21 == __position._M_node) break;
LAB_0015f405:
    auVar46._4_4_ = -(uint)(*(float *)((long)&p_Var21[1]._M_next + 4) != 0.0);
    auVar46._0_4_ = -(uint)(*(float *)&p_Var21[1]._M_next != 0.0);
    auVar46._8_4_ = -(uint)(*(float *)&p_Var21[1]._M_prev != 1.0);
    auVar46._12_4_ = -(uint)(*(float *)((long)&p_Var21[1]._M_prev + 4) != 1.0);
    iVar16 = movmskps(iVar16,auVar46);
    if ((iVar16 != 0) ||
       (0.008726646 < *(float *)&p_Var21[2]._M_next || *(float *)&p_Var21[2]._M_next == 0.008726646)
       ) break;
  }
  p_Var24 = std::__cxx11::list<Assimp::STransformVecInfo,std::allocator<Assimp::STransformVecInfo>>
            ::_M_create_node<Assimp::STransformVecInfo_const&>
                      ((list<Assimp::STransformVecInfo,std::allocator<Assimp::STransformVecInfo>> *)
                       p_Var18,(STransformVecInfo *)(__position._M_node + 1));
  std::__detail::_List_node_base::_M_hook(&p_Var24->super__List_node_base);
  p_Var18[1]._M_next = (_List_node_base *)((long)&(p_Var18[1]._M_next)->_M_next + 1);
  std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::
  _M_erase((list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_> *)p_Var18,
           __position);
LAB_0015eb47:
  if (bVar31) {
    p_Var19 = p_Var18->_M_next;
    if (p_Var19 == p_Var18) {
      local_664 = 0;
    }
    else {
      uVar30 = 0;
      local_664 = 0;
      do {
        uVar15 = *(uint *)&p_Var19[3]._M_next;
        if (uVar15 != uVar30 && uVar15 != 0xeeeeeeee) {
          p_Var21 = p_Var18;
          do {
            p_Var21 = p_Var21->_M_next;
          } while (uVar15 != 0);
          if (*(int *)&p_Var21[3]._M_next == -0x11111112) {
            local_5a8 = *(ai_real *)&p_Var21[2]._M_next;
            local_5b8 = p_Var21[1];
            uStack_5a4 = *(undefined8 *)((long)&p_Var21[2]._M_next + 4);
            uVar12 = *(undefined8 *)((long)&p_Var21[2]._M_prev + 4);
            aStack_59c = (aiTextureMapMode)uVar12;
            uStack_598 = (uint)((ulong)uVar12 >> 0x20);
            pp_Var1 = &p_Var21[3]._M_prev;
            p_Var22 = p_Var21[3]._M_prev;
            p_Var27 = p_Var21[4]._M_next;
            local_588._8_8_ = p_Var21[4]._M_prev;
            p_Stack_590 = (_List_node_base *)&p_Stack_590;
            local_588._0_8_ = &p_Stack_590;
            if (p_Var22 != (_List_node_base *)pp_Var1) {
              p_Var27->_M_next = (_List_node_base *)&p_Stack_590;
              p_Var22->_M_prev = (_List_node_base *)&p_Stack_590;
              p_Var21[4]._M_next = (_List_node_base *)pp_Var1;
              p_Var21[3]._M_prev = (_List_node_base *)pp_Var1;
              p_Var21[4]._M_prev = (_List_node_base *)0x0;
              p_Stack_590 = p_Var22;
              local_588._0_8_ = p_Var27;
            }
            *(undefined4 *)&p_Var21[2]._M_next = *(undefined4 *)&p_Var19[2]._M_next;
            p_Var22 = p_Var19[1]._M_prev;
            p_Var21[1]._M_next = p_Var19[1]._M_next;
            p_Var21[1]._M_prev = p_Var22;
            uVar12 = *(undefined8 *)((long)&p_Var19[2]._M_prev + 4);
            *(undefined8 *)((long)&p_Var21[2]._M_next + 4) =
                 *(undefined8 *)((long)&p_Var19[2]._M_next + 4);
            *(undefined8 *)((long)&p_Var21[2]._M_prev + 4) = uVar12;
            std::__cxx11::list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>::
            _M_move_assign((list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *)
                           pp_Var1,&p_Var19[3]._M_prev);
            *(ai_real *)&p_Var19[2]._M_next = local_5a8;
            p_Var19[1]._M_next = local_5b8._M_next;
            p_Var19[1]._M_prev = local_5b8._M_prev;
            *(undefined8 *)((long)&p_Var19[2]._M_next + 4) = uStack_5a4;
            *(ulong *)((long)&p_Var19[2]._M_prev + 4) = CONCAT44(uStack_598,aStack_59c);
            std::__cxx11::list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>::
            _M_move_assign((list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *)
                           &p_Var19[3]._M_prev);
            p_Var21 = p_Stack_590;
            while (p_Var21 != (_List_node_base *)&p_Stack_590) {
              p_Var22 = *(_List_node_base **)
                         &((_List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>
                            *)&p_Var21->_M_next)->_M_impl;
              operator_delete(p_Var21);
              p_Var21 = p_Var22;
            }
            if (*(uint *)&p_Var19[3]._M_next == local_664) {
              local_664 = uVar30;
            }
          }
          else {
            pLVar17 = DefaultLogger::get();
            Logger::error(pLVar17,
                          "Channel mismatch, can\'t compute all transformations properly [design bug]"
                         );
          }
        }
        uVar30 = uVar30 + 1;
        p_Var19 = p_Var19->_M_next;
      } while (p_Var19 != p_Var18);
    }
    lVar20 = 0;
    do {
      ppaVar3 = ppaVar2 + lVar20;
      auVar44._0_4_ = -(uint)(*(int *)ppaVar3 == 0);
      auVar44._4_4_ = -(uint)(*(int *)((long)ppaVar3 + 4) == 0);
      auVar44._8_4_ = -(uint)(*(int *)(ppaVar3 + 1) == 0);
      auVar44._12_4_ = -(uint)(*(int *)((long)ppaVar3 + 0xc) == 0);
      auVar48._4_4_ = auVar44._0_4_;
      auVar48._0_4_ = auVar44._4_4_;
      auVar48._8_4_ = auVar44._12_4_;
      auVar48._12_4_ = auVar44._8_4_;
      auVar49 = packssdw(auVar48 & auVar44,auVar48 & auVar44);
      auVar49 = packssdw(auVar49,auVar49);
      auVar49 = packsswb(auVar49,auVar49);
      *(ushort *)((long)auStack_618 + lVar20) = auVar49._0_2_ & (ushort)DAT_001f3e60;
      lVar20 = lVar20 + 2;
    } while (lVar20 != 8);
    for (p_Var19 = p_Var18->_M_next; p_Var19 != p_Var18; p_Var19 = p_Var19->_M_next) {
      *(undefined1 *)((long)auStack_618 + (ulong)*(uint *)((long)&p_Var19[2]._M_next + 4)) = 1;
    }
    lVar20 = 0;
    do {
      if (*(char *)((long)auStack_618 + lVar20) == '\0') {
        local_5b8 = (_List_node_base)(ZEXT816(0x3f8000003f800000) << 0x40);
        local_5a8 = 0.0;
        uStack_5a4._0_4_ = 0;
        uStack_5a4._4_4_ = aiTextureMapMode_Wrap;
        aStack_59c = aiTextureMapMode_Wrap;
        uStack_598 = 0xeeeeeeee;
        local_588._8_8_ = 0;
        local_588._0_8_ = &p_Stack_590;
        p_Stack_590 = (_List_node_base *)&p_Stack_590;
        std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::
        _M_insert<Assimp::STransformVecInfo>
                  ((list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_> *)
                   p_Var18,(iterator)p_Var18,(STransformVecInfo *)&local_5b8);
        p_Var19 = p_Stack_590;
        while (p_Var19 != (_List_node_base *)&p_Stack_590) {
          p_Var21 = *(_List_node_base **)
                     &((_List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *)
                      &p_Var19->_M_next)->_M_impl;
          operator_delete(p_Var19);
          p_Var19 = p_Var21;
        }
        *(int *)((long)&p_Var18->_M_prev[2]._M_next + 4) = (int)lVar20;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 8);
    p_Var19 = p_Var18[1]._M_next;
    uVar30 = (uint)p_Var19;
    if (8 < uVar30) {
      bVar13 = DefaultLogger::isNullLogger();
      if (!bVar13) {
        pLVar17 = DefaultLogger::get();
        local_624 = *(uint *)&p_Var18[1]._M_next;
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<unsigned_int>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_5b8,&local_624);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_5b8," UV channels required but just ",0x1f);
        std::ostream::operator<<((ostream *)&local_5b8,8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8," available",10);
        std::__cxx11::stringbuf::str();
        Logger::error(pLVar17,local_610);
        if (local_610 != local_600) {
          operator_delete(local_610);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_5b8);
        std::ios_base::~ios_base(local_548);
      }
      p_Var19 = p_Var18[1]._M_next;
      uVar30 = 8;
    }
    auVar49 = *(undefined1 (*) [16])(paVar10->mTextureCoords + 2);
    auVar43 = *(undefined1 (*) [16])(paVar10->mTextureCoords + 4);
    local_588._0_16_ = *(undefined1 (*) [16])(paVar10->mTextureCoords + 6);
    uStack_598 = auVar43._0_4_;
    uStack_594 = auVar43._4_4_;
    p_Stack_590 = auVar43._8_8_;
    local_5a8 = auVar49._0_4_;
    uStack_5a4 = auVar49._4_8_;
    aStack_59c = auVar49._12_4_;
    local_5b8._M_next = (_List_node_base *)ppaVar2[0];
    local_5b8._M_prev = (_List_node_base *)ppaVar2[1];
    pScene = local_620;
    if (p_Var19 != (_List_node_base *)0x0) {
      p_Var21 = (_List_node_base *)0x0;
      p_Var19 = p_Var18;
      do {
        p_Var19 = p_Var19->_M_next;
        uVar15 = (uint)p_Var21;
        if (uVar15 < uVar30) {
          bVar13 = DefaultLogger::isNullLogger();
          if (!bVar13) {
            pcVar34 = "-c";
            if (*(int *)&p_Var19[2]._M_prev == 2) {
              pcVar34 = "-m";
            }
            if (*(int *)&p_Var19[2]._M_prev == 0) {
              pcVar34 = "-w";
            }
            iVar16 = *(int *)((long)&p_Var19[2]._M_prev + 4);
            pcVar26 = "-c";
            if (iVar16 == 2) {
              pcVar26 = "-m";
            }
            if (iVar16 == 0) {
              pcVar26 = "-w";
            }
            snprintf((char *)local_438,0x400,
                     "Mesh %u, channel %u: t(%.3f,%.3f), s(%.3f,%.3f), r(%.3f), %s%s",
                     (double)*(float *)&p_Var19[1]._M_next,
                     (double)*(float *)((long)&p_Var19[1]._M_next + 4),
                     SUB84((double)*(float *)&p_Var19[1]._M_prev,0),
                     (double)*(float *)((long)&p_Var19[1]._M_prev + 4),
                     (double)(*(float *)&p_Var19[2]._M_next * 57.29578),uVar36,p_Var21,pcVar34,
                     pcVar26);
            pLVar17 = DefaultLogger::get();
            Logger::info(pLVar17,(char *)local_438);
          }
          __s = ppaVar2[(long)p_Var21];
          p_Var22 = p_Var19;
          p_Var27 = p_Var21;
          if (__s == (aiVector3D *)0x0) {
            uVar25 = paVar10->mNumVertices;
            uVar37 = (ulong)uVar25 * 0xc;
            __s = (aiVector3D *)operator_new__(uVar37);
          }
          else {
            do {
              p_Var22 = p_Var22->_M_next;
              uVar25 = (int)p_Var27 + 1;
              if (uVar30 <= uVar25) {
                if (p_Var22 != p_Var18->_M_next) goto LAB_0015f087;
                break;
              }
              p_Var27 = (_List_node_base *)(ulong)uVar25;
            } while (*(uint *)((long)&p_Var22[2]._M_next + 4) != uVar15);
            uVar25 = paVar10->mNumVertices;
            uVar37 = (ulong)uVar25 * 0xc;
            __s = (aiVector3D *)operator_new__(uVar37);
          }
          if (uVar25 != 0) {
            memset(__s,0,((uVar37 - 0xc) / 0xc) * 0xc + 0xc);
          }
          ppaVar2[(long)p_Var21] = __s;
LAB_0015f087:
          uVar25 = *(uint *)((long)&p_Var19[2]._M_next + 4);
          __src = *(aiVector3D **)
                   ((long)&(((STransformVecInfo *)&local_5b8)->super_aiUVTransform).mTranslation +
                   (ulong)uVar25 * 8);
          if (__src == (aiVector3D *)0x0) {
            __assert_fail("__null != src",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/TextureTransform.cpp"
                          ,0x1fe,"virtual void Assimp::TextureTransformStep::Execute(aiScene *)");
          }
          if (__s != __src) {
            pvVar23 = memcpy(__s,__src,(ulong)paVar10->mNumVertices * 0xc);
            uVar25 = (uint)pvVar23;
          }
          uVar7 = paVar10->mNumVertices;
          fVar51 = *(float *)&p_Var19[1]._M_next;
          fVar47 = *(float *)((long)&p_Var19[1]._M_next + 4);
          fVar65 = *(float *)&p_Var19[1]._M_prev;
          fVar67 = *(float *)((long)&p_Var19[1]._M_prev + 4);
          fVar42 = *(float *)&p_Var19[2]._M_next;
          auVar45._4_4_ = -(uint)(fVar47 != 0.0);
          auVar45._0_4_ = -(uint)(fVar51 != 0.0);
          auVar45._8_4_ = -(uint)(fVar65 != 1.0);
          auVar45._12_4_ = -(uint)(fVar67 != 1.0);
          iVar16 = movmskps(uVar25,auVar45);
          if ((iVar16 != 0) || (0.008726646 <= fVar42)) {
            if (fVar42 <= 0.008726646) {
              fVar52 = 0.0;
              fVar42 = 1.0;
              uStack_5d4 = 0;
              fVar41 = 0.0;
            }
            else {
              local_5c8 = fVar51;
              fStack_5c4 = fVar47;
              fStack_5c0 = fVar65;
              fStack_5bc = fVar67;
              local_5d8 = cosf(fVar42);
              uStack_5d4 = extraout_XMM0_Db;
              fVar41 = sinf(fVar42);
              fVar52 = -fVar41;
              fVar51 = *(float *)&p_Var19[1]._M_next;
              fVar47 = *(float *)((long)&p_Var19[1]._M_next + 4);
              fVar65 = fStack_5c0;
              fVar67 = fStack_5bc;
              fVar42 = local_5d8;
            }
            iVar14 = iVar14 + 1;
            fVar69 = fVar65 + 0.0;
            fVar70 = fVar65 * 0.0 + 0.0 + 0.0;
            fVar71 = fVar65 + 0.0;
            fVar72 = fVar67 + 0.0;
            fVar62 = fVar67 * 0.0 + 0.0;
            fVar63 = fVar67 + 0.0;
            fVar65 = fVar65 + 0.0;
            fVar67 = fVar67 + 0.0;
            fVar53 = fVar69 * 0.0 + fVar62 * 0.0 + 0.5;
            fVar54 = fVar70 * 0.0 + fVar63 * 0.0 + 0.5;
            fVar55 = fVar71 * 0.0 + fVar65 * 0.0 + 0.0;
            fVar56 = fVar72 * 0.0 + fVar67 * 0.0 + 0.0;
            fVar61 = fVar70 * 0.0 + fVar62 * 0.0 + 1.0;
            if (uVar7 != 0) {
              pfVar4 = &__s[uVar7].x;
              fVar51 = fVar51 + 0.0;
              fVar47 = fVar47 + 0.0;
              fVar57 = fVar42 * fVar69 + fVar41 * fVar62 + 0.0;
              fVar58 = fVar42 * fVar70 + fVar41 * fVar63 + 0.0;
              fVar59 = fVar42 * fVar71 + fVar41 * fVar65 + 0.0;
              fVar60 = fVar42 * fVar72 + fVar41 * fVar67 + 0.0;
              fVar69 = fVar52 * fVar69 + fVar62 * fVar42 + 0.0;
              fVar63 = fVar52 * fVar70 + fVar63 * fVar42 + 0.0;
              fVar65 = fVar52 * fVar71 + fVar65 * fVar42 + 0.0;
              fVar71 = fVar52 * fVar72 + fVar67 * fVar42 + 0.0;
              fVar73 = fVar42 * fVar70 + fVar41 * fVar62 + 0.0;
              fVar62 = fVar52 * fVar70 + fVar62 * fVar42 + 0.0;
              fVar42 = fVar53 * 0.0;
              fVar67 = fVar54 * 0.0;
              fVar41 = fVar55 * 0.0;
              fVar52 = fVar56 * 0.0;
              fVar72 = fVar69 * 0.0 + fVar57 + fVar42;
              fVar64 = fVar63 * 0.0 + fVar58 + fVar67;
              fVar66 = fVar65 * 0.0 + fVar59 + fVar41;
              fVar68 = fVar71 * 0.0 + fVar60 + fVar52;
              fVar42 = fVar57 * 0.0 + fVar69 + fVar42;
              fVar67 = fVar58 * 0.0 + fVar63 + fVar67;
              fVar41 = fVar59 * 0.0 + fVar65 + fVar41;
              fVar52 = fVar60 * 0.0 + fVar71 + fVar52;
              fVar53 = fVar57 * -0.5 + fVar69 * -0.5 + fVar53;
              fVar54 = fVar58 * -0.5 + fVar63 * -0.5 + fVar54;
              fVar55 = fVar59 * 0.0 + fVar65 * 0.0 + fVar55;
              fVar56 = fVar60 * 0.0 + fVar71 * 0.0 + fVar56;
              fVar63 = fVar61 * 0.0;
              fVar65 = fVar62 * 0.0 + fVar73 + fVar63;
              fVar63 = fVar73 * 0.0 + fVar62 + fVar63;
              fVar61 = fVar73 * -0.5 + fVar62 * -0.5 + fVar61;
              fVar62 = fVar53 * 0.0;
              fVar69 = fVar54 * 0.0;
              fVar70 = fVar55 * 0.0;
              fVar71 = fVar56 * 0.0;
              fVar57 = fVar61 * 0.0;
              do {
                fVar58 = __s->x;
                fVar59 = __s->y;
                fVar60 = (fVar63 * 0.0 + fVar65 + fVar57) * fVar58 +
                         (fVar65 * 0.0 + fVar63 + fVar57) * fVar59 +
                         fVar63 * fVar47 + fVar51 * fVar65 + fVar61;
                auVar50._0_4_ =
                     fVar58 * (fVar42 * 0.0 + fVar72 + fVar62) +
                     fVar59 * (fVar62 + fVar72 * 0.0 + fVar42) +
                     fVar51 * fVar72 + fVar47 * fVar42 + fVar53;
                auVar50._4_4_ =
                     fVar58 * (fVar67 * 0.0 + fVar64 + fVar69) +
                     fVar59 * (fVar69 + fVar64 * 0.0 + fVar67) +
                     fVar51 * fVar64 + fVar47 * fVar67 + fVar54;
                auVar50._8_4_ =
                     (fVar41 * 0.0 + fVar66 + fVar70) * 0.0 + (fVar70 + fVar66 * 0.0 + fVar41) * 0.0
                     + fVar51 * fVar66 + fVar47 * fVar41 + fVar55;
                auVar50._12_4_ =
                     (fVar52 * 0.0 + fVar68 + fVar71) * 0.0 + (fVar71 + fVar68 * 0.0 + fVar52) * 0.0
                     + fVar51 * fVar68 + fVar47 * fVar52 + fVar56;
                auVar11._4_4_ = fVar60;
                auVar11._0_4_ = fVar60;
                auVar11._8_4_ = uStack_5d4;
                auVar11._12_4_ = uStack_5d4;
                auVar49 = divps(auVar50,auVar11);
                __s->x = (float)(int)auVar49._0_8_;
                __s->y = (float)(int)((ulong)auVar49._0_8_ >> 0x20);
                __s->z = 0.0;
                __s = __s + 1;
              } while (__s != (aiVector3D *)pfVar4);
            }
          }
          UpdateUVIndex((list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *)
                        &p_Var19[3]._M_prev,uVar15);
        }
        else {
          UpdateUVIndex((list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *)
                        &p_Var19[3]._M_prev,local_664);
        }
        p_Var21 = (_List_node_base *)(ulong)(uVar15 + 1);
        pScene = local_620;
      } while (p_Var21 < p_Var18[1]._M_next);
    }
  }
LAB_0015f3ec:
  p_Var19 = (_List_node_base *)(ulong)(uint)(iVar28 + (int)lVar40);
  uVar36 = uVar36 + 1;
  if (pScene->mNumMeshes <= uVar36) goto LAB_0015f474;
  goto LAB_0015ea1f;
}

Assistant:

void TextureTransformStep::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("TransformUVCoordsProcess begin");


    /*  We build a per-mesh list of texture transformations we'll need
     *  to apply. To achieve this, we iterate through all materials,
     *  find all textures and get their transformations and UV indices.
     *  Then we search for all meshes using this material.
     */
    typedef std::list<STransformVecInfo> MeshTrafoList;
    std::vector<MeshTrafoList> meshLists(pScene->mNumMeshes);

    for (unsigned int i = 0; i < pScene->mNumMaterials;++i) {

        aiMaterial* mat = pScene->mMaterials[i];
        for (unsigned int a = 0; a < mat->mNumProperties;++a)   {

            aiMaterialProperty* prop = mat->mProperties[a];
            if (!::strcmp( prop->mKey.data, "$tex.file"))   {
                STransformVecInfo info;

                // Setup a shortcut structure to allow for a fast updating
                // of the UV index later
                TTUpdateInfo update;
                update.mat = (aiMaterial*) mat;
                update.semantic = prop->mSemantic;
                update.index = prop->mIndex;

                // Get textured properties and transform
                for (unsigned int a2 = 0; a2 < mat->mNumProperties;++a2)  {
                    aiMaterialProperty* prop2 = mat->mProperties[a2];
                    if (prop2->mSemantic != prop->mSemantic || prop2->mIndex != prop->mIndex) {
                        continue;
                    }

                    if ( !::strcmp( prop2->mKey.data, "$tex.uvwsrc")) {
                        info.uvIndex = *((int*)prop2->mData);

                        // Store a direct pointer for later use
                        update.directShortcut = (unsigned int*) prop2->mData;
                    }

                    else if ( !::strcmp( prop2->mKey.data, "$tex.mapmodeu")) {
                        info.mapU = *((aiTextureMapMode*)prop2->mData);
                    }
                    else if ( !::strcmp( prop2->mKey.data, "$tex.mapmodev")) {
                        info.mapV = *((aiTextureMapMode*)prop2->mData);
                    }
                    else if ( !::strcmp( prop2->mKey.data, "$tex.uvtrafo"))  {
                        // ValidateDS should check this
                        ai_assert(prop2->mDataLength >= 20);
                        ::memcpy(&info.mTranslation.x,prop2->mData,sizeof(float)*5);

                        // Directly remove this property from the list
                        mat->mNumProperties--;
                        for (unsigned int a3 = a2; a3 < mat->mNumProperties;++a3) {
                            mat->mProperties[a3] = mat->mProperties[a3+1];
                        }

                        delete prop2;

                        // Warn: could be an underflow, but this does not invoke undefined behaviour
                        --a2;
                    }
                }

                // Find out which transformations are to be evaluated
                if (!(configFlags & AI_UVTRAFO_ROTATION)) {
                    info.mRotation = 0.f;
                }
                if (!(configFlags & AI_UVTRAFO_SCALING)) {
                    info.mScaling = aiVector2D(1.f,1.f);
                }
                if (!(configFlags & AI_UVTRAFO_TRANSLATION)) {
                    info.mTranslation = aiVector2D(0.f,0.f);
                }

                // Do some preprocessing
                PreProcessUVTransform(info);
                info.uvIndex = std::min(info.uvIndex,AI_MAX_NUMBER_OF_TEXTURECOORDS -1u);

                // Find out whether this material is used by more than
                // one mesh. This will make our task much, much more difficult!
                unsigned int cnt = 0;
                for (unsigned int n = 0; n < pScene->mNumMeshes;++n)    {
                    if (pScene->mMeshes[n]->mMaterialIndex == i)
                        ++cnt;
                }

                if (!cnt)
                    continue;
                else if (1 != cnt)  {
                    // This material is referenced by more than one mesh!
                    // So we need to make sure the UV index for the texture
                    // is identical for each of it ...
                    info.lockedPos = AI_TT_UV_IDX_LOCK_TBD;
                }

                // Get all corresponding meshes
                for (unsigned int n = 0; n < pScene->mNumMeshes;++n)    {
                    aiMesh* mesh = pScene->mMeshes[n];
                    if (mesh->mMaterialIndex != i || !mesh->mTextureCoords[0])
                        continue;

                    unsigned int uv = info.uvIndex;
                    if (!mesh->mTextureCoords[uv])  {
                        // If the requested UV index is not available, take the first one instead.
                        uv = 0;
                    }

                    if (mesh->mNumUVComponents[info.uvIndex] >= 3){
                        ASSIMP_LOG_WARN("UV transformations on 3D mapping channels are not supported");
                        continue;
                    }

                    MeshTrafoList::iterator it;

                    // Check whether we have this transform setup already
                    for (it = meshLists[n].begin();it != meshLists[n].end(); ++it)  {

                        if ((*it) == info && (*it).uvIndex == uv)   {
                            (*it).updateList.push_back(update);
                            break;
                        }
                    }

                    if (it == meshLists[n].end())   {
                        meshLists[n].push_back(info);
                        meshLists[n].back().uvIndex = uv;
                        meshLists[n].back().updateList.push_back(update);
                    }
                }
            }
        }
    }

    char buffer[1024]; // should be sufficiently large
    unsigned int outChannels = 0, inChannels = 0, transformedChannels = 0;

    // Now process all meshes. Important: we don't remove unreferenced UV channels.
    // This is a job for the RemoveUnreferencedData-Step.
    for (unsigned int q = 0; q < pScene->mNumMeshes;++q)    {

        aiMesh* mesh = pScene->mMeshes[q];
        MeshTrafoList& trafo =  meshLists[q];

        inChannels += mesh->GetNumUVChannels();

        if (!mesh->mTextureCoords[0] || trafo.empty() ||  (trafo.size() == 1 && trafo.begin()->IsUntransformed())) {
            outChannels += mesh->GetNumUVChannels();
            continue;
        }

        // Move untransformed UV channels to the first position in the list ....
        // except if we need a new locked index which should be as small as possible
        bool veto = false, need = false;
        unsigned int cnt = 0;
        unsigned int untransformed = 0;

        MeshTrafoList::iterator it,it2;
        for (it = trafo.begin();it != trafo.end(); ++it,++cnt)  {

            if (!(*it).IsUntransformed()) {
                need = true;
            }

            if ((*it).lockedPos == AI_TT_UV_IDX_LOCK_TBD)   {
                // Lock this index and make sure it won't be changed
                (*it).lockedPos = cnt;
                veto = true;
                continue;
            }

            if (!veto && it != trafo.begin() && (*it).IsUntransformed())    {
                for (it2 = trafo.begin();it2 != it; ++it2) {
                    if (!(*it2).IsUntransformed())
                        break;
                }
                trafo.insert(it2,*it);
                trafo.erase(it);
                break;
            }
        }
        if (!need)
            continue;

        // Find all that are not at their 'locked' position and move them to it.
        // Conflicts are possible but quite unlikely.
        cnt = 0;
        for (it = trafo.begin();it != trafo.end(); ++it,++cnt) {
            if ((*it).lockedPos != AI_TT_UV_IDX_LOCK_NONE && (*it).lockedPos != cnt) {
                it2 = trafo.begin();unsigned int t = 0;
                while (t != (*it).lockedPos)
                    ++it2;

                if ((*it2).lockedPos != AI_TT_UV_IDX_LOCK_NONE) {
                    ASSIMP_LOG_ERROR("Channel mismatch, can't compute all transformations properly [design bug]");
                    continue;
                }

                std::swap(*it2,*it);
                if ((*it).lockedPos == untransformed)
                    untransformed = cnt;
            }
        }

        // ... and add dummies for all unreferenced channels
        // at the end of the list
        bool ref[AI_MAX_NUMBER_OF_TEXTURECOORDS];
        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n)
            ref[n] = (!mesh->mTextureCoords[n] ? true : false);

        for (it = trafo.begin();it != trafo.end(); ++it)
            ref[(*it).uvIndex] = true;

        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n) {
            if (ref[n])
                continue;
            trafo.push_back(STransformVecInfo());
            trafo.back().uvIndex = n;
        }

        // Then check whether this list breaks the channel limit.
        // The unimportant ones are at the end of the list, so
        // it shouldn't be too worse if we remove them.
        unsigned int size = (unsigned int)trafo.size();
        if (size > AI_MAX_NUMBER_OF_TEXTURECOORDS) {

            if (!DefaultLogger::isNullLogger()) {
                ASSIMP_LOG_ERROR_F(static_cast<unsigned int>(trafo.size()), " UV channels required but just ", 
                    AI_MAX_NUMBER_OF_TEXTURECOORDS, " available");
            }
            size = AI_MAX_NUMBER_OF_TEXTURECOORDS;
        }


        aiVector3D* old[AI_MAX_NUMBER_OF_TEXTURECOORDS];
        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n)
            old[n] = mesh->mTextureCoords[n];

        // Now continue and generate the output channels. Channels
        // that we're not going to need later can be overridden.
        it = trafo.begin();
        for (unsigned int n = 0; n < trafo.size();++n,++it) {

            if (n >= size)  {
                // Try to use an untransformed channel for all channels we threw over board
                UpdateUVIndex((*it).updateList,untransformed);
                continue;
            }

            outChannels++;

            // Write to the log
            if (!DefaultLogger::isNullLogger()) {
                ::ai_snprintf(buffer,1024,"Mesh %u, channel %u: t(%.3f,%.3f), s(%.3f,%.3f), r(%.3f), %s%s",
                    q,n,
                    (*it).mTranslation.x,
                    (*it).mTranslation.y,
                    (*it).mScaling.x,
                    (*it).mScaling.y,
                    AI_RAD_TO_DEG( (*it).mRotation),
                    MappingModeToChar ((*it).mapU),
                    MappingModeToChar ((*it).mapV));

                ASSIMP_LOG_INFO(buffer);
            }

            // Check whether we need a new buffer here
            if (mesh->mTextureCoords[n])    {

                it2 = it;++it2;
                for (unsigned int m = n+1; m < size;++m, ++it2) {

                    if ((*it2).uvIndex == n){
                        it2 = trafo.begin();
                        break;
                    }
                }
                if (it2 == trafo.begin()){
                    mesh->mTextureCoords[n] = new aiVector3D[mesh->mNumVertices];
                }
            }
            else mesh->mTextureCoords[n] = new aiVector3D[mesh->mNumVertices];

            aiVector3D* src = old[(*it).uvIndex];
            aiVector3D* dest, *end;
            dest = mesh->mTextureCoords[n];

            ai_assert(NULL != src);

            // Copy the data to the destination array
            if (dest != src)
                ::memcpy(dest,src,sizeof(aiVector3D)*mesh->mNumVertices);

            end = dest + mesh->mNumVertices;

            // Build a transformation matrix and transform all UV coords with it
            if (!(*it).IsUntransformed()) {
                const aiVector2D& trl = (*it).mTranslation;
                const aiVector2D& scl = (*it).mScaling;

                // fixme: simplify ..
                ++transformedChannels;
                aiMatrix3x3 matrix;

                aiMatrix3x3 m2,m3,m4,m5;

                m4.a1 = scl.x;
                m4.b2 = scl.y;

                m2.a3 = m2.b3 = 0.5f;
                m3.a3 = m3.b3 = -0.5f;

                if ((*it).mRotation > AI_TT_ROTATION_EPSILON )
                    aiMatrix3x3::RotationZ((*it).mRotation,matrix);

                m5.a3 += trl.x; m5.b3 += trl.y;
                matrix = m2 * m4 * matrix * m3 * m5;

                for (src = dest; src != end; ++src) { /* manual homogenious divide */
                    src->z = 1.f;
                    *src = matrix * *src;
                    src->x /= src->z;
                    src->y /= src->z;
                    src->z = 0.f;
                }
            }

            // Update all UV indices
            UpdateUVIndex((*it).updateList,n);
        }
    }

    // Print some detailed statistics into the log
    if (!DefaultLogger::isNullLogger()) {

        if (transformedChannels)    {
            ASSIMP_LOG_INFO_F("TransformUVCoordsProcess end: ", outChannels, " output channels (in: ", inChannels, ", modified: ", transformedChannels,")");
        } else {
            ASSIMP_LOG_DEBUG("TransformUVCoordsProcess finished");
        }
    }
}